

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetDependsClosure
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *depends)

{
  bool bVar1;
  TargetType TVar2;
  reference pcVar3;
  cmGeneratorTarget *pcVar4;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  cmGeneratorTarget *local_50;
  _Base_ptr local_48;
  undefined1 local_40;
  _Self local_38;
  _Self local_30;
  const_iterator i;
  cmTargetDependSet *targetDeps;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *depends_local;
  cmGeneratorTarget *target_local;
  cmGlobalNinjaGenerator *this_local;
  
  i._M_node = (_Base_ptr)cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target)
  ;
  local_30._M_node =
       (_Base_ptr)
       std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::begin
                 ((set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *
                  )i._M_node);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                   (i._M_node);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    pcVar3 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&local_30);
    pcVar4 = cmTargetDepend::operator->(pcVar3);
    TVar2 = cmGeneratorTarget::GetType(pcVar4);
    if (TVar2 != INTERFACE_LIBRARY) {
      pcVar3 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&local_30);
      local_50 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(pcVar3);
      pVar5 = std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::insert(depends,&local_50);
      local_48 = (_Base_ptr)pVar5.first._M_node;
      local_40 = pVar5.second;
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar3 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&local_30);
        pcVar4 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(pcVar3);
        ComputeTargetDependsClosure(this,pcVar4,depends);
      }
    }
    std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&local_30);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::ComputeTargetDependsClosure(
  cmGeneratorTarget const* target, std::set<cmGeneratorTarget const*>& depends)
{
  cmTargetDependSet const& targetDeps = this->GetTargetDirectDepends(target);
  for (cmTargetDependSet::const_iterator i = targetDeps.begin();
       i != targetDeps.end(); ++i) {
    if ((*i)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    if (depends.insert(*i).second) {
      this->ComputeTargetDependsClosure(*i, depends);
    }
  }
}